

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_2>,_tcu::Vector<double,_2>_>::call
          (unary<tcu::Vector<double,_2>,_tcu::Vector<double,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  double local_58 [2];
  code *local_48;
  functionPointer p_function;
  Vector<double,_2> arg;
  Vector<double,_2> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Vector<double,_2>,_tcu::Vector<double,_2>_> *this_local;
  
  tcu::Vector<double,_2>::Vector((Vector<double,_2> *)(arg.m_data + 1));
  tcu::Vector<double,_2>::Vector((Vector<double,_2> *)&p_function);
  unpack<tcu::Vector<double,_2>_>::get(argument_src,(Vector<double,_2> *)&p_function);
  local_48 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_48)(local_58,&p_function);
  arg.m_data[1] = local_58[0];
  pack<tcu::Vector<double,_2>_>::set(result_dst,(Vector<double,_2> *)(arg.m_data + 1));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}